

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O2

void mpp_enc_add_sw_header(MppEncImpl *enc,HalEncTask *hal_task)

{
  int size;
  RK_U32 RVar1;
  EncRcTask *pEVar2;
  MppPacket dst;
  MppFrame frame;
  MppEncUserDataFull *pMVar3;
  void *data;
  EncImpl impl;
  RK_S32 RVar4;
  MppMeta meta;
  MppEncUserDataSet *pMVar5;
  uint uVar6;
  RK_U8 *uuid;
  RK_U32 i;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  RK_S32 local_4c;
  EncImpl local_48;
  RK_S32 length;
  MppEncUserDataSet *user_datas;
  
  local_48 = enc->impl;
  pEVar2 = hal_task->rc_task;
  dst = hal_task->packet;
  frame = hal_task->frame;
  if (((uint)enc->hdr_status & 0xe) != 0) goto LAB_00142c44;
  if (enc->hdr_mode == MPP_ENC_HEADER_MODE_EACH_IDR) {
    bVar9 = ((pEVar2->frm).val & 0x10) == 0;
    if ((enc->cfg).rc.refresh_en != 0) goto LAB_00142e6d;
    bVar10 = true;
    if (((pEVar2->frm).val & 0x10) == 0) goto LAB_00142c44;
  }
  else {
    bVar9 = true;
    if ((enc->cfg).rc.refresh_en == 0) goto LAB_00142c44;
LAB_00142e6d:
    bVar10 = ((pEVar2->frm).val & 0x8000000020) != 0x8000000000;
    if ((bool)(bVar10 & bVar9)) goto LAB_00142c44;
  }
  if (((byte)mpp_enc_debug & 0x20) != 0) {
    _mpp_log_l(4,"mpp_enc","task %d IDR header length %d\n","mpp_enc_add_sw_header",
               (ulong)*(ushort *)((long)&pEVar2->frm + 6));
  }
  mpp_packet_append(dst,enc->hdr_pkt);
  RVar1 = enc->hdr_len;
  hal_task->header_length = RVar1;
  hal_task->length = hal_task->length + RVar1;
  *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 4;
  if ((!bVar10) && (0 < (int)enc->sei_mode)) {
    _length = (int *)((ulong)_length & 0xffffffff00000000);
    enc_impl_add_prefix(local_48,dst,&length,uuid_refresh_cfg,&(enc->cfg).rc.refresh_length,0);
    if (length != 0) {
      if (((byte)mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","task %d refresh header length %d\n","mpp_enc_add_sw_header",
                   (ulong)*(ushort *)((long)&pEVar2->frm + 6),(ulong)enc->hdr_len);
      }
      hal_task->sei_length = hal_task->sei_length + length;
      hal_task->length = hal_task->length + length;
    }
  }
LAB_00142c44:
  check_hal_task_pkt_len(hal_task,"header adding");
  impl = local_48;
  if ((((ulong)pEVar2->frm & 0x20) != 0) && (0 < (int)enc->sei_mode)) {
    _length = (int *)((ulong)_length & 0xffffffff00000000);
    enc_impl_add_prefix(local_48,dst,&length,uuid_version,enc->version_info,enc->version_length);
    hal_task->sei_length = hal_task->sei_length + length;
    hal_task->length = hal_task->length + length;
    _length = (int *)((ulong)_length & 0xffffffff00000000);
    enc_impl_add_prefix(impl,dst,&length,uuid_rc_cfg,enc->rc_cfg_info,enc->rc_cfg_length);
    hal_task->sei_length = hal_task->sei_length + length;
    hal_task->length = hal_task->length + length;
  }
  RVar4 = mpp_frame_has_meta(frame);
  if (RVar4 != 0) {
    meta = mpp_frame_get_meta(frame);
    _length = (int *)0x0;
    user_datas = (MppEncUserDataSet *)0x0;
    local_4c = 0;
    mpp_meta_get_ptr(meta,KEY_USER_DATA,(void **)&length);
    if (_length != (int *)0x0) {
      if (*_length == 0 || *(void **)(_length + 2) == (void *)0x0) {
        _mpp_log_l(2,"mpp_enc","failed to insert user data %p len %d\n","update_user_datas");
      }
      else {
        enc_impl_add_prefix(local_48,dst,&local_4c,uuid_usr_data,*(void **)(_length + 2),*_length);
        hal_task->sei_length = hal_task->sei_length + local_4c;
        hal_task->length = hal_task->length + local_4c;
      }
    }
    mpp_meta_get_ptr(meta,KEY_USER_DATAS,&user_datas);
    if ((user_datas != (MppEncUserDataSet *)0x0) && (uVar6 = user_datas->count, uVar6 != 0)) {
      lVar8 = 0x10;
      pMVar5 = user_datas;
      for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
        pMVar3 = pMVar5->datas;
        data = *(void **)((long)&pMVar3->len + lVar8);
        if ((data != (void *)0x0) && (size = *(int *)((long)pMVar3 + lVar8 + -0x10), size != 0)) {
          uuid = *(RK_U8 **)((long)pMVar3 + lVar8 + -8);
          if (uuid == (RK_U8 *)0x0) {
            uuid = uuid_debug_info;
          }
          enc_impl_add_prefix(local_48,dst,&local_4c,uuid,data,size);
          hal_task->sei_length = hal_task->sei_length + local_4c;
          hal_task->length = hal_task->length + local_4c;
          uVar6 = user_datas->count;
          pMVar5 = user_datas;
        }
        lVar8 = lVar8 + 0x18;
      }
    }
  }
  check_hal_task_pkt_len(hal_task,"user data adding");
  return;
}

Assistant:

static void mpp_enc_add_sw_header(MppEncImpl *enc, HalEncTask *hal_task)
{
    EncImpl impl = enc->impl;
    MppEncHeaderStatus *hdr_status = &enc->hdr_status;
    EncRcTask *rc_task = hal_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MppPacket packet = hal_task->packet;
    MppFrame frame = hal_task->frame;

    if (!(hdr_status->val & HDR_ADDED_MASK)) {
        RK_U32 add_header = 0;

        if (enc->hdr_mode == MPP_ENC_HEADER_MODE_EACH_IDR && frm->is_intra)
            add_header |= 1;

        if (enc->cfg.rc.refresh_en && frm->is_i_recovery && !frm->is_idr)
            add_header |= 2;

        if (add_header) {
            enc_dbg_detail("task %d IDR header length %d\n",
                           frm->seq_idx, enc->hdr_len);

            mpp_packet_append(packet, enc->hdr_pkt);

            hal_task->header_length = enc->hdr_len;
            hal_task->length += enc->hdr_len;
            hdr_status->added_by_mode = 1;
        }

        if ((add_header & 2) && enc->sei_mode >= MPP_ENC_SEI_MODE_ONE_SEQ) {
            RK_S32 length = 0;

            enc_impl_add_prefix(impl, packet, &length, uuid_refresh_cfg,
                                &enc->cfg.rc.refresh_length, 0);

            if (length) {
                enc_dbg_detail("task %d refresh header length %d\n",
                               frm->seq_idx, enc->hdr_len);

                hal_task->sei_length += length;
                hal_task->length += length;
            }
        }
    }

    // check for header adding
    check_hal_task_pkt_len(hal_task, "header adding");

    /* 17. Add all prefix info before encoding */
    if (frm->is_idr && enc->sei_mode >= MPP_ENC_SEI_MODE_ONE_SEQ) {
        RK_S32 length = 0;

        enc_impl_add_prefix(impl, packet, &length, uuid_version,
                            enc->version_info, enc->version_length);

        hal_task->sei_length += length;
        hal_task->length += length;

        length = 0;
        enc_impl_add_prefix(impl, packet, &length, uuid_rc_cfg,
                            enc->rc_cfg_info, enc->rc_cfg_length);

        hal_task->sei_length += length;
        hal_task->length += length;
    }

    if (mpp_frame_has_meta(frame)) {
        update_user_datas(impl, packet, frame, hal_task);
    }

    // check for user data adding
    check_hal_task_pkt_len(hal_task, "user data adding");
}